

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Flow(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *p;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  uint fUseMfs;
  int nLevels;
  char *pcVar5;
  char *pcVar6;
  uint fVerbose;
  int iVar7;
  uint fMinAve;
  uint local_48;
  uint local_44;
  
  fMinAve = 0;
  Extra_UtilGetoptReset();
  local_44 = 8;
  local_48 = 6;
  fUseMfs = 0;
  fVerbose = 0;
LAB_002811ce:
  do {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"KCtmvh"), iVar7 = globalUtilOptind, iVar3 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar3 < 0x4b) {
      if (iVar3 == -1) {
        p = pAbc->pGia;
        if (p != (Gia_Man_t *)0x0) {
          pVVar2 = p->vMapping;
          iVar7 = p->vCos->nSize;
          iVar3 = p->vCis->nSize;
          iVar1 = p->nObjs;
          nLevels = Gia_ManLevelNum(p);
          Gia_ManPerformFlow((uint)(pVVar2 != (Vec_Int_t *)0x0),~(iVar7 + iVar3) + iVar1,nLevels,
                             local_48,local_44,fMinAve,fUseMfs,fVerbose);
          return 0;
        }
        pcVar5 = "Abc_CommandAbc9Flow(): There is no AIG.\n";
        iVar7 = -1;
        goto LAB_002813eb;
      }
      if (iVar3 != 0x43) goto LAB_00281326;
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0028131a:
        Abc_Print(-1,pcVar5);
        goto LAB_00281326;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_44 = uVar4;
    }
    else {
      if (iVar3 == 0x74) {
        fMinAve = fMinAve ^ 1;
        goto LAB_002811ce;
      }
      if (iVar3 == 0x6d) {
        fUseMfs = fUseMfs ^ 1;
        goto LAB_002811ce;
      }
      if (iVar3 != 0x4b) goto LAB_00281326;
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-K\" should be followed by an integer.\n";
        goto LAB_0028131a;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_48 = uVar4;
    }
    globalUtilOptind = iVar7 + 1;
    if ((int)uVar4 < 0) {
LAB_00281326:
      Abc_Print(-2,"usage: &flow [-KC num] [-tmvh]\n");
      Abc_Print(-2,"\t         integration optimization and mapping flow\n");
      Abc_Print(-2,"\t-K num : the number of LUT inputs (LUT size) [default = %d]\n",(ulong)local_48
               );
      Abc_Print(-2,"\t-C num : the number of cuts at a node [default = %d]\n",(ulong)local_44);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (fMinAve == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle minimizing average rather than max delay [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (fUseMfs == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle using \"mfs2\" in the script [default = %s]\n",pcVar5);
      if (fVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      pcVar5 = "\t-h     : print the command usage\n";
      iVar7 = -2;
LAB_002813eb:
      Abc_Print(iVar7,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Flow( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManPerformFlow( int fIsMapped, int nAnds, int nLevels, int nLutSize, int nCutNum, int fMinAve, int fUseMfs, int fVerbose );
    int nLutSize    =  6;
    int nCutNum     =  8;
    int fMinAve     =  0;
    int fUseMfs     =  0;
    int c, fVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCtmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
         case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutNum < 0 )
                goto usage;
            break;
        case 't':
            fMinAve ^= 1;
            break;
        case 'm':
            fUseMfs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Flow(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManPerformFlow( Gia_ManHasMapping(pAbc->pGia), Gia_ManAndNum(pAbc->pGia), Gia_ManLevelNum(pAbc->pGia), nLutSize, nCutNum, fMinAve, fUseMfs, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &flow [-KC num] [-tmvh]\n" );
    Abc_Print( -2, "\t         integration optimization and mapping flow\n" );
    Abc_Print( -2, "\t-K num : the number of LUT inputs (LUT size) [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-C num : the number of cuts at a node [default = %d]\n", nCutNum );
    Abc_Print( -2, "\t-t     : toggle minimizing average rather than max delay [default = %s]\n", fMinAve? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle using \"mfs2\" in the script [default = %s]\n", fUseMfs? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}